

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintExpressionContents::visitDrop(PrintExpressionContents *this,Drop *curr)

{
  ostream *poVar1;
  bool bVar2;
  size_t sVar3;
  string_view local_38;
  string_view local_28;
  Drop *local_18;
  Drop *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (Drop *)this;
  bVar2 = wasm::Type::isTuple(&curr->value->type);
  if (bVar2) {
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"tuple.drop ");
    printMedium(poVar1,local_28);
    poVar1 = this->o;
    sVar3 = wasm::Type::size(&local_18->value->type);
    std::ostream::operator<<(poVar1,sVar3);
  }
  else {
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"drop");
    printMedium(poVar1,local_38);
  }
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    if (curr->value->type.isTuple()) {
      printMedium(o, "tuple.drop ");
      o << curr->value->type.size();
    } else {
      printMedium(o, "drop");
    }
  }